

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

BIGNUM * BN_lebin2bn(uchar *s,int len,BIGNUM *ret)

{
  BIGNUM *a;
  BIGNUM *pBVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint words;
  byte *pbVar7;
  bool bVar8;
  ulong uVar6;
  
  if (ret == (BIGNUM *)0x0) {
    a = (BIGNUM *)CRYPTO_zalloc(0x18);
    if (a != (BIGNUM *)0x0) {
      a->flags = 1;
      ret = (BIGNUM *)a;
      goto LAB_001128ad;
    }
    ret = (BIGNUM *)0x0;
  }
  a = (BIGNUM *)0x0;
LAB_001128ad:
  if (ret != (BIGNUM *)0x0) {
    pbVar7 = s + len;
    if (0 < len) {
      do {
        if (pbVar7[-1] != 0) goto LAB_001128da;
        pbVar7 = pbVar7 + -1;
        bVar8 = 1 < len;
        len = len + -1;
      } while (bVar8);
      len = 0;
    }
LAB_001128da:
    if (len == 0) {
      ((BIGNUM *)ret)->top = 0;
      return ret;
    }
    uVar5 = len - 1U >> 3;
    uVar4 = (ulong)uVar5;
    words = uVar5 + 1;
    uVar6 = (ulong)words;
    if (((int)uVar5 < ((BIGNUM *)ret)->dmax) ||
       (pBVar1 = bn_expand2((BIGNUM *)ret,words), pBVar1 != (BIGNUM *)0x0)) {
      uVar5 = len - 1U & 7;
      ((BIGNUM *)ret)->top = words;
      ((BIGNUM *)ret)->neg = 0;
      uVar2 = 0;
      do {
        pbVar7 = pbVar7 + -1;
        uVar2 = (ulong)*pbVar7 | uVar2 << 8;
        bVar8 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar8) {
          uVar6 = (ulong)((int)uVar6 - 1);
          ((BIGNUM *)ret)->d[uVar6] = uVar2;
          uVar5 = 7;
          uVar2 = 0;
        }
        len = len + -1;
      } while (len != 0);
      do {
        if (((BIGNUM *)ret)->d[uVar4] != 0) {
          iVar3 = (int)uVar4 + 1;
          goto LAB_0011297b;
        }
        uVar4 = uVar4 - 1;
      } while (1 < (int)uVar4 + 2);
      iVar3 = 0;
LAB_0011297b:
      ((BIGNUM *)ret)->top = iVar3;
      if (iVar3 != 0) {
        return ret;
      }
      ((BIGNUM *)ret)->neg = 0;
      return ret;
    }
    BN_free(a);
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *BN_lebin2bn(const unsigned char *s, int len, BIGNUM *ret)
{
    unsigned int i, m;
    unsigned int n;
    BN_ULONG l;
    BIGNUM *bn = NULL;

    if (ret == NULL)
        ret = bn = BN_new();
    if (ret == NULL)
        return (NULL);
    bn_check_top(ret);
    s += len;
    /* Skip trailing zeroes. */
    for ( ; len > 0 && s[-1] == 0; s--, len--)
        continue;
    n = len;
    if (n == 0) {
        ret->top = 0;
        return ret;
    }
    i = ((n - 1) / BN_BYTES) + 1;
    m = ((n - 1) % (BN_BYTES));
    if (bn_wexpand(ret, (int)i) == NULL) {
        BN_free(bn);
        return NULL;
    }
    ret->top = i;
    ret->neg = 0;
    l = 0;
    while (n--) {
        s--;
        l = (l << 8L) | *s;
        if (m-- == 0) {
            ret->d[--i] = l;
            l = 0;
            m = BN_BYTES - 1;
        }
    }
    /*
     * need to call this due to clear byte at top if avoiding having the top
     * bit set (-ve number)
     */
    bn_correct_top(ret);
    return ret;
}